

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::CaseStatementSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,CaseStatementSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (CaseStatementSyntax *)0x0:
    return (PtrTokenOrSyntax *)
           *(__index_type **)
            ((long)&__return_storage_ptr__[1].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (CaseStatementSyntax *)0x1:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[2].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  case (CaseStatementSyntax *)0x2:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[5].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (CaseStatementSyntax *)0x3:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[6].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (CaseStatementSyntax *)0x4:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[7].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (CaseStatementSyntax *)0x5:
    return (PtrTokenOrSyntax *)
           *(__index_type **)
            ((long)&__return_storage_ptr__[8].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (CaseStatementSyntax *)0x6:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 9);
    break;
  case (CaseStatementSyntax *)0x7:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 10);
    break;
  case (CaseStatementSyntax *)0x8:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[0xb].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  case (CaseStatementSyntax *)0x9:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[0xe].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax CaseStatementSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return &uniqueOrPriority;
        case 3: return &caseKeyword;
        case 4: return &openParen;
        case 5: return expr.get();
        case 6: return &closeParen;
        case 7: return &matchesOrInside;
        case 8: return &items;
        case 9: return &endcase;
        default: return nullptr;
    }
}